

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O3

int formore(void)

{
  long lVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  int i_1;
  longlong factorials [16];
  long local_a8 [17];
  
  lVar1 = 1;
  local_a8[0] = 1;
  local_a8[1] = 1;
  lVar3 = 2;
  do {
    lVar1 = lVar1 * lVar3;
    local_a8[lVar3] = lVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  lVar1 = 0;
  do {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"! = ",4);
    poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return 0;
}

Assistant:

int formore () {
    long long factorials[ArSize];
    factorials[1] = factorials[0] = 1LL;

    for (int i = 2; i < ArSize; i++) {
        factorials[i] = i * factorials[i - 1];
    }

    for (int i = 0; i < ArSize; i++) {
        std::cout << i << "! = " << factorials[i] << std::endl;
    }

    return 0;
}